

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
* __thiscall
S2Polygon::Release(vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                   *__return_storage_ptr__,S2Polygon *this)

{
  S2LatLngRect local_80;
  S2LatLngRect local_58;
  undefined1 local_19;
  S2Polygon *local_18;
  S2Polygon *this_local;
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  *loops;
  
  local_19 = 0;
  local_18 = this;
  this_local = (S2Polygon *)__return_storage_ptr__;
  std::
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ::vector(__return_storage_ptr__);
  std::
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ::swap(__return_storage_ptr__,&this->loops_);
  ClearLoops(this);
  this->num_vertices_ = 0;
  S2LatLngRect::Empty();
  S2LatLngRect::operator=(&this->bound_,&local_58);
  S2LatLngRect::~S2LatLngRect(&local_58);
  S2LatLngRect::Empty();
  S2LatLngRect::operator=(&this->subregion_bound_,&local_80);
  S2LatLngRect::~S2LatLngRect(&local_80);
  return __return_storage_ptr__;
}

Assistant:

vector<unique_ptr<S2Loop>> S2Polygon::Release() {
  // Reset the polygon to be empty.
  vector<unique_ptr<S2Loop>> loops;
  loops.swap(loops_);
  ClearLoops();
  num_vertices_ = 0;
  bound_ = S2LatLngRect::Empty();
  subregion_bound_ = S2LatLngRect::Empty();
  return loops;
}